

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O0

int tlv_parse_interest(uint8_t *buf,size_t buflen,int argc,...)

{
  char in_AL;
  _Bool _Var1;
  uint64_t uVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  bool local_299;
  int *local_298;
  undefined8 *local_280;
  long *local_268;
  long *local_250;
  undefined8 *local_238;
  long *local_220;
  long *local_208;
  long *local_1f0;
  long *local_1d8;
  long *local_1c0;
  undefined8 *local_1a8;
  undefined8 *local_190;
  uint32_t *local_170;
  undefined1 local_158 [24];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  byte local_99;
  ndn_hmac_key_t *pnStack_98;
  _Bool verify_sig;
  void *key_ptr;
  void *arg_ptr;
  uint8_t **params_ptr;
  uint8_t **namebuf_ptr;
  uint8_t *end;
  uint8_t *valptr;
  uint8_t *ptr;
  uint32_t local_58;
  uint32_t block_len;
  uint32_t block_type;
  TLV_INTARG_TYPE argtype;
  int ret;
  int i;
  va_list vl;
  int argc_local;
  size_t buflen_local;
  uint8_t *buf_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  block_type = 0;
  namebuf_ptr = (uint8_t **)(buf + buflen);
  params_ptr = (uint8_t **)0x0;
  arg_ptr = (void *)0x0;
  key_ptr = (void *)0x0;
  pnStack_98 = (ndn_hmac_key_t *)0x0;
  local_99 = 0;
  local_140 = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  valptr = tlv_get_type_length(buf,buflen,&local_58,(uint32_t *)((long)&ptr + 4));
  if (valptr == (uint8_t *)0x0) {
    buf_local._4_4_ = 0xfffffff2;
  }
  else if (local_58 == 5) {
    if ((uint8_t **)(valptr + ptr._4_4_) == namebuf_ptr) {
      block_type = ndn_interest_from_block(&tlv_parse_interest::interest,buf,(uint32_t)buflen);
      buf_local._4_4_ = block_type;
      if (block_type == 0) {
        vl[0].overflow_arg_area = local_158;
        vl[0]._0_8_ = &stack0x00000008;
        i = 0x30;
        ret = 0x18;
        for (argtype = TLV_INTARG_NAME_PTR; (int)argtype < argc && block_type == 0;
            argtype = argtype + TLV_INTARG_NAME_BUF) {
          if ((uint)ret < 0x29) {
            local_170 = (uint32_t *)((long)ret + (long)vl[0].overflow_arg_area);
            ret = ret + 8;
          }
          else {
            local_170 = (uint32_t *)vl[0]._0_8_;
            vl[0]._0_8_ = vl[0]._0_8_ + 8;
          }
          block_len = *local_170;
          switch(block_len) {
          case 0:
            if ((uint)ret < 0x29) {
              local_190 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_190 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_190;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              memcpy(key_ptr,&tlv_parse_interest::interest,0x1bc);
            }
            break;
          case 1:
            if ((uint)ret < 0x29) {
              local_1a8 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1a8 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            params_ptr = (uint8_t **)*local_1a8;
            if (params_ptr == (uint8_t **)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *params_ptr = (uint8_t *)0x0;
            }
            break;
          case 2:
            if ((uint)ret < 0x29) {
              local_1c0 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1c0 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_1c0;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else if (tlv_parse_interest::interest.name.components_size == '\0') {
              block_type = 0xffffffef;
            }
            else {
              uVar2 = tlv_decode_segno(tlv_parse_interest::interest.name.components +
                                       (int)(tlv_parse_interest::interest.name.components_size - 1))
              ;
              *(uint64_t *)key_ptr = uVar2;
            }
            break;
          case 3:
            if ((uint)ret < 0x29) {
              local_1d8 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1d8 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_1d8;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              _Var1 = ndn_interest_get_CanBePrefix(&tlv_parse_interest::interest);
              *(_Bool *)key_ptr = _Var1;
            }
            break;
          case 4:
            if ((uint)ret < 0x29) {
              local_1f0 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_1f0 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_1f0;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              _Var1 = ndn_interest_get_MustBeFresh(&tlv_parse_interest::interest);
              *(_Bool *)key_ptr = _Var1;
            }
            break;
          case 5:
            if ((uint)ret < 0x29) {
              local_208 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_208 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_208;
            if ((uint64_t *)key_ptr == (uint64_t *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *(uint64_t *)key_ptr = tlv_parse_interest::interest.lifetime;
            }
            break;
          case 6:
            if ((uint)ret < 0x29) {
              local_220 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_220 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_220;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              _Var1 = ndn_interest_has_HopLimit(&tlv_parse_interest::interest);
              if (_Var1) {
                *(uint8_t *)key_ptr = tlv_parse_interest::interest.hop_limit;
              }
              else {
                *(undefined1 *)key_ptr = 0xff;
              }
            }
            break;
          case 7:
            if ((uint)ret < 0x29) {
              local_238 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_238 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            arg_ptr = (void *)*local_238;
            if ((undefined8 *)arg_ptr == (undefined8 *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              *(undefined8 *)arg_ptr = 0;
            }
            break;
          case 8:
            if ((uint)ret < 0x29) {
              local_250 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_250 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_250;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              _Var1 = ndn_interest_has_Parameters(&tlv_parse_interest::interest);
              if (_Var1) {
                *(ulong *)key_ptr = (ulong)tlv_parse_interest::interest.parameters.size;
              }
              else {
                *(undefined8 *)key_ptr = 0;
              }
            }
            break;
          case 9:
            if ((uint)ret < 0x29) {
              local_268 = (long *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_268 = (long *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            key_ptr = (void *)*local_268;
            if (key_ptr == (void *)0x0) {
              block_type = 0xfffffff0;
            }
            else {
              _Var1 = ndn_interest_is_signed(&tlv_parse_interest::interest);
              if (_Var1) {
                *(uint8_t *)key_ptr = tlv_parse_interest::interest.signature.sig_type;
              }
              else {
                *(undefined1 *)key_ptr = 0xff;
              }
            }
            break;
          default:
            block_type = 0xffffffee;
            break;
          case 0xb:
            if ((uint)ret < 0x29) {
              local_280 = (undefined8 *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_280 = (undefined8 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            pnStack_98 = (ndn_hmac_key_t *)*local_280;
            break;
          case 0xc:
            if ((uint)ret < 0x29) {
              local_298 = (int *)((long)ret + (long)vl[0].overflow_arg_area);
              ret = ret + 8;
            }
            else {
              local_298 = (int *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            local_99 = *local_298 != 0;
          }
        }
        if (block_type == 0) {
          end = tlv_get_type_length(valptr,(long)namebuf_ptr - (long)valptr,&local_58,
                                    (uint32_t *)((long)&ptr + 4));
          if (local_58 == 7) {
            if (params_ptr != (uint8_t **)0x0) {
              *params_ptr = valptr;
            }
            valptr = end + ptr._4_4_;
            if (((arg_ptr != (void *)0x0) &&
                (_Var1 = ndn_interest_has_Parameters(&tlv_parse_interest::interest), _Var1)) &&
               (tlv_parse_interest::interest.parameters.size != 0)) {
              do {
                end = tlv_get_type_length(valptr,(long)namebuf_ptr - (long)valptr,&local_58,
                                          (uint32_t *)((long)&ptr + 4));
                valptr = end + ptr._4_4_;
                local_299 = local_58 != 0x24 && valptr < namebuf_ptr;
              } while (local_299);
              *(uint8_t **)arg_ptr = end;
            }
            if (((local_99 & 1) != 0) &&
               (_Var1 = ndn_interest_is_signed(&tlv_parse_interest::interest), _Var1)) {
              if (tlv_parse_interest::interest.signature.sig_type == '\0') {
                block_type = ndn_signed_interest_digest_verify(&tlv_parse_interest::interest);
              }
              else if (tlv_parse_interest::interest.signature.sig_type == '\x03') {
                if (pnStack_98 == (ndn_hmac_key_t *)0x0) {
                  block_type = 0xfffffff0;
                }
                else {
                  block_type = ndn_signed_interest_ecdsa_verify
                                         (&tlv_parse_interest::interest,(ndn_ecc_pub_t *)pnStack_98)
                  ;
                }
              }
              else if (tlv_parse_interest::interest.signature.sig_type == '\x04') {
                if (pnStack_98 == (ndn_hmac_key_t *)0x0) {
                  block_type = 0xfffffff0;
                }
                else {
                  block_type = ndn_signed_interest_hmac_verify
                                         (&tlv_parse_interest::interest,pnStack_98);
                }
              }
              else {
                block_type = 0xffffffe6;
              }
            }
            buf_local._4_4_ = block_type;
          }
          else {
            buf_local._4_4_ = 0xffffffef;
          }
        }
        else {
          buf_local._4_4_ = block_type;
        }
      }
    }
    else {
      buf_local._4_4_ = 0xfffffff3;
    }
  }
  else {
    buf_local._4_4_ = 0xfffffff4;
  }
  return buf_local._4_4_;
}

Assistant:

int
tlv_parse_interest(uint8_t* buf, size_t buflen, int argc, ...)
{
  static ndn_interest_t interest;
  va_list vl;
  int i, ret = NDN_SUCCESS;
  enum TLV_INTARG_TYPE argtype;
  uint32_t block_type, block_len;
  uint8_t *ptr, *valptr, *end = buf + buflen;
  uint8_t **namebuf_ptr = NULL;
  uint8_t **params_ptr = NULL;
  void *arg_ptr = NULL;
  void *key_ptr = NULL;
  bool verify_sig = false;

  // Check type and length
  ptr = tlv_get_type_length(buf, buflen, &block_type, &block_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (block_type != TLV_Interest) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (ptr + block_len != end) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Decode interest
  ret = ndn_interest_from_block(&interest, buf, buflen);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Parse args
  va_start(vl, argc);
  for (i = 0; i < argc && ret == NDN_SUCCESS; i++) {
    argtype = va_arg(vl, int);
    switch(argtype) {
      case TLV_INTARG_NAME_PTR:
        arg_ptr = va_arg(vl, ndn_name_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(ndn_name_t*)arg_ptr = interest.name;
        break;

      case TLV_INTARG_NAME_BUF:
        namebuf_ptr = va_arg(vl, uint8_t**);
        if (namebuf_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *namebuf_ptr = NULL;
        break;

      case TLV_INTARG_NAME_SEGNO_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (interest.name.components_size > 0) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&interest.name.components[interest.name.components_size - 1]);
        }
        else {
          ret = NDN_UNSUPPORTED_FORMAT;
        }
        break;

      case TLV_INTARG_CANBEPREFIX_BOOL:
        arg_ptr = va_arg(vl, bool*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(bool*)arg_ptr = ndn_interest_get_CanBePrefix(&interest);
        break;

      case TLV_INTARG_MUSTBEFRESH_BOOL:
        arg_ptr = va_arg(vl, bool*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(bool*)arg_ptr = ndn_interest_get_MustBeFresh(&interest);
        break;

      case TLV_INTARG_LIFETIME_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(uint64_t*)arg_ptr = interest.lifetime;
        break;

      case TLV_INTARG_HOTLIMIT_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (ndn_interest_has_HopLimit(&interest)) {
          *(uint8_t*)arg_ptr = interest.hop_limit;
        }
        else {
          *(uint8_t*)arg_ptr = 0xFF;
        }
        break;

      case TLV_INTARG_PARAMS_BUF:
        params_ptr = va_arg(vl, uint8_t**);
        if (params_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *params_ptr = NULL;
        break;

      case TLV_INTARG_PARAMS_SIZE:
        arg_ptr = va_arg(vl, size_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (ndn_interest_has_Parameters(&interest)) {
          *(size_t*)arg_ptr = (size_t)interest.parameters.size;
        }
        else {
          *(size_t*)arg_ptr = 0;
        }
        break;

      case TLV_INTARG_SIGTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (ndn_interest_is_signed(&interest)) {
          *(uint8_t*)arg_ptr = interest.signature.sig_type;
        }
        else {
          *(uint8_t*)arg_ptr = (uint8_t)-1;
        }
        break;

      case TLV_INTARG_SIGKEY_PTR:
        key_ptr = va_arg(vl, void*);
        break;

      case TLV_INTARG_VERIFY:
        verify_sig = va_arg(vl, uint32_t);
        break;

      default:
        ret = NDN_INVALID_ARG;
        break;
    }
  }
  va_end(vl);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Decode Name (No need to check for NULL since decoding succeeded)
  valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
  if (block_type != TLV_Name) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  if (namebuf_ptr != NULL) {
    *namebuf_ptr = ptr;
  }
  ptr = valptr + block_len;

  // Content if applicable
  if (params_ptr && ndn_interest_has_Parameters(&interest) && interest.parameters.size > 0) {
    do {
      valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
      ptr = valptr + block_len;
    } while (block_type != TLV_ApplicationParameters && ptr < end);
    *params_ptr = valptr;
  }

  // Verify if required
  if (verify_sig && ndn_interest_is_signed(&interest)) {
    switch(interest.signature.sig_type) {
      case NDN_SIG_TYPE_DIGEST_SHA256:
        ret = ndn_signed_interest_digest_verify(&interest);
        break;

      case NDN_SIG_TYPE_ECDSA_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_signed_interest_ecdsa_verify(&interest, (ndn_ecc_pub_t*)key_ptr);
        }
        break;

      case NDN_SIG_TYPE_HMAC_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_signed_interest_hmac_verify(&interest, (ndn_hmac_key_t*)key_ptr);
        }
        break;

      default:
        ret = NDN_SEC_UNSUPPORT_SIGN_TYPE;
        break;
    }
  }

  return ret;
}